

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_tmpref(jit_State *J,TRef tr,int mode)

{
  TRef TVar1;
  TRef local_34;
  int mode_local;
  TRef tr_local;
  jit_State *J_local;
  
  local_34 = tr;
  if ((tr >> 0x18 & 0x1f) - 0xf < 5) {
    (J->fold).ins.field_0.ot = 0x5b0e;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0x1d3;
    local_34 = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = 0x3f09;
  (J->fold).ins.field_0.op1 = (IRRef1)local_34;
  (J->fold).ins.field_0.op2 = (IRRef1)mode;
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef recff_tmpref(jit_State *J, TRef tr, int mode)
{
  if (!LJ_DUALNUM && tref_isinteger(tr))
    tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
  return emitir(IRT(IR_TMPREF, IRT_PGC), tr, mode);
}